

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_file.cpp
# Opt level: O1

Read<signed_char> __thiscall
Omega_h::binary::swap_bytes<signed_char>(binary *this,Read<signed_char> *array,bool needs_swapping)

{
  int *piVar1;
  Alloc *pAVar2;
  _Alloc_hider _Var3;
  undefined7 in_register_00000011;
  void *pvVar4;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  LO n;
  bool bVar5;
  Read<signed_char> RVar6;
  Write<signed_char> out;
  type f;
  Alloc *local_68;
  void *pvStack_60;
  string local_50;
  Write<signed_char> local_30;
  Read<signed_char> local_20;
  
  if ((int)CONCAT71(in_register_00000011,needs_swapping) == 0) {
    pAVar2 = (array->write_).shared_alloc_.alloc;
    *(Alloc **)this = pAVar2;
    *(void **)(this + 8) = (array->write_).shared_alloc_.direct_ptr;
    bVar5 = ((ulong)pAVar2 & 7) != 0;
    pvVar4 = (void *)CONCAT71(in_register_00000011,bVar5 || pAVar2 == (Alloc *)0x0);
    if ((!bVar5 && pAVar2 != (Alloc *)0x0) && (entering_parallel == '\x01')) {
      pAVar2->use_count = pAVar2->use_count + -1;
      *(size_t *)this = pAVar2->size * 8 + 1;
    }
    (array->write_).shared_alloc_.alloc = (Alloc *)0x0;
    (array->write_).shared_alloc_.direct_ptr = (void *)0x0;
  }
  else {
    local_20.write_.shared_alloc_.alloc = (array->write_).shared_alloc_.alloc;
    if (((ulong)local_20.write_.shared_alloc_.alloc & 7) == 0 &&
        local_20.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_20.write_.shared_alloc_.alloc =
             (Alloc *)((local_20.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_20.write_.shared_alloc_.alloc)->use_count =
             (local_20.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_20.write_.shared_alloc_.direct_ptr = (array->write_).shared_alloc_.direct_ptr;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
    deep_copy<signed_char>((Omega_h *)&local_68,&local_20,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    pAVar2 = local_20.write_.shared_alloc_.alloc;
    if (((ulong)local_20.write_.shared_alloc_.alloc & 7) == 0 &&
        local_20.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_20.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_20.write_.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
      }
    }
    local_50._M_dataplus._M_p = (pointer)local_68;
    if (((ulong)local_68 & 7) == 0 && local_68 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_50._M_dataplus._M_p = (pointer)(local_68->size * 8 + 1);
      }
      else {
        local_68->use_count = local_68->use_count + 1;
      }
    }
    local_50._M_string_length = (size_type)pvStack_60;
    if (((ulong)local_68 & 1) == 0) {
      n = (LO)local_68->size;
    }
    else {
      n = (LO)((ulong)local_68 >> 3);
    }
    parallel_for<Omega_h::binary::swap_bytes<signed_char>(Omega_h::Read<signed_char>,bool)::_lambda(int)_1_>
              (n,(type *)&local_50,"swap_if_needed");
    local_30.shared_alloc_.alloc = local_68;
    local_30.shared_alloc_.direct_ptr = pvStack_60;
    if ((((ulong)local_68 & 7) == 0 && local_68 != (Alloc *)0x0) && (entering_parallel == '\x01')) {
      local_68->use_count = local_68->use_count + -1;
      local_30.shared_alloc_.alloc = (Alloc *)(local_68->size * 8 + 1);
    }
    local_68 = (Alloc *)0x0;
    pvStack_60 = (void *)0x0;
    Read<signed_char>::Read((Read<signed_char> *)this,&local_30);
    pAVar2 = local_30.shared_alloc_.alloc;
    pvVar4 = extraout_RDX;
    if (((ulong)local_30.shared_alloc_.alloc & 7) == 0 &&
        local_30.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_30.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_30.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
        pvVar4 = extraout_RDX_00;
      }
    }
    _Var3._M_p = local_50._M_dataplus._M_p;
    if (((ulong)local_50._M_dataplus._M_p & 7) == 0 &&
        (Alloc *)local_50._M_dataplus._M_p != (Alloc *)0x0) {
      piVar1 = (int *)(local_50._M_dataplus._M_p + 0x30);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc((Alloc *)local_50._M_dataplus._M_p);
        operator_delete(_Var3._M_p,0x48);
        pvVar4 = extraout_RDX_01;
      }
    }
    pAVar2 = local_68;
    if (((ulong)local_68 & 7) == 0 && local_68 != (Alloc *)0x0) {
      piVar1 = &local_68->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_68);
        operator_delete(pAVar2,0x48);
        pvVar4 = extraout_RDX_02;
      }
    }
  }
  RVar6.write_.shared_alloc_.direct_ptr = pvVar4;
  RVar6.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar6.write_.shared_alloc_;
}

Assistant:

Read<T> swap_bytes(Read<T> array, bool needs_swapping) {
  if (!needs_swapping) return array;
  Write<T> out = deep_copy(array);
  auto f = OMEGA_H_LAMBDA(LO i) { SwapBytes<T>::swap(&out[i]); };
  parallel_for(out.size(), f, "swap_if_needed");
  return out;
}